

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_null_check_end(t_netstd_generator *this,ostream *out,t_field *tfield)

{
  t_field *ptVar1;
  t_type *ttype;
  ostream *poVar2;
  string local_48;
  undefined1 local_22;
  byte local_21;
  bool null_allowed;
  t_field *ptStack_20;
  bool is_required;
  t_field *tfield_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  ptStack_20 = tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  local_21 = field_is_required(tfield);
  ttype = t_field::get_type(ptStack_20);
  local_22 = type_can_be_null(ttype);
  if (((bool)local_22) || ((local_21 & 1) == 0)) {
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)ptVar1,(string *)&local_48);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_null_check_end(ostream& out, t_field* tfield) {
    bool is_required = field_is_required(tfield);
    bool null_allowed = type_can_be_null(tfield->get_type());

    if( null_allowed || (!is_required)) {
        indent_down();
        out << indent() << "}" << endl;
    }
}